

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if.h
# Opt level: O0

word * If_CutTruthW(If_Man_t *p,If_Cut_t *pCut)

{
  int nWords;
  word *pOut;
  int fCompl;
  word *pIn;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  if (-1 < pCut->iCutFunc) {
    pOut = p->puTempW;
    pIn = If_CutTruthWR(p,pCut);
    nWords = p->nTruth6Words[*(uint *)&pCut->field_0x1c >> 0x18];
    fCompl = If_CutTruthIsCompl(pCut);
    Abc_TtCopy(pOut,pIn,nWords,fCompl);
    return p->puTempW;
  }
  __assert_fail("pCut->iCutFunc >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
}

Assistant:

static inline word *     If_CutTruthW( If_Man_t * p, If_Cut_t * pCut )       { assert( pCut->iCutFunc >= 0 ); Abc_TtCopy( p->puTempW, If_CutTruthWR(p, pCut), p->nTruth6Words[pCut->nLeaves], If_CutTruthIsCompl(pCut) ); return p->puTempW;  }